

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O2

ROOM_INDEX_DATA * get_room_index(int vnum)

{
  ROOM_INDEX_DATA *pRVar1;
  string_view fmt;
  int vnum_local;
  
  pRVar1 = (ROOM_INDEX_DATA *)(room_index_hash + vnum % 0x400);
  do {
    pRVar1 = pRVar1->next;
    if (pRVar1 == (ROOM_INDEX_DATA *)0x0) {
      if (!fBootDb) {
        return pRVar1;
      }
      fmt._M_str = "Get_room_index: bad vnum %d.";
      fmt._M_len = 0x1c;
      CLogger::Error<int&>((CLogger *)&wear_locations,fmt,&vnum_local);
      exit(1);
    }
  } while (pRVar1->vnum != vnum);
  return pRVar1;
}

Assistant:

ROOM_INDEX_DATA *get_room_index(int vnum)
{
	ROOM_INDEX_DATA *pRoomIndex;

	for (pRoomIndex = room_index_hash[vnum % MAX_KEY_HASH]; pRoomIndex != nullptr; pRoomIndex = pRoomIndex->next)
	{
		if (pRoomIndex->vnum == vnum)
			return pRoomIndex;
	}

	if (fBootDb)
	{
		RS.Logger.Error("Get_room_index: bad vnum %d.", vnum);
		exit(1);
	}

	return nullptr;
}